

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O0

_Type_ARRAY * __thiscall
LiteScript::_Type_ARRAY::ToString_abi_cxx11_(_Type_ARRAY *this,Variable *object)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  Object *pOVar4;
  ostream *poVar5;
  char *pcVar6;
  Type *this_00;
  Variable *in_RDX;
  Variable local_230 [2];
  undefined1 local_210 [8];
  Variable v;
  uint sz_1;
  uint i_1;
  Variable local_1e8 [2];
  uint local_1c8;
  uint local_1c4;
  uint sz;
  uint i;
  Array *obj;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  Variable *local_20;
  Variable *object_local;
  _Type_ARRAY *this_local;
  
  local_20 = in_RDX;
  object_local = object;
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::operator<<(local_198,"{");
  pOVar4 = Variable::operator->(local_20);
  _sz = Object::GetData<LiteScript::Array>(pOVar4);
  local_1c4 = 0;
  local_1c8 = Array::UnamedCount(_sz);
  for (; local_1c4 < local_1c8; local_1c4 = local_1c4 + 1) {
    iVar2 = Array::ExistUnamed(_sz,local_1c4);
    if (iVar2 != 0) {
      poVar5 = std::operator<<(local_198,"[");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1c4);
      poVar5 = std::operator<<(poVar5,"]:");
      Array::ConstantGet((Array *)&sz_1,(uint)_sz);
      Variable::operator_cast_to_string(local_1e8);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      std::operator<<(poVar5,pcVar6);
      std::__cxx11::string::~string((string *)local_1e8);
      Variable::~Variable((Variable *)&sz_1);
      if (local_1c4 < local_1c8 - 1) {
        std::operator<<(local_198,",");
      }
    }
  }
  uVar3 = Array::UnamedCount(_sz);
  if ((uVar3 != 0) && (uVar3 = Array::NamedCount(_sz), uVar3 != 0)) {
    std::operator<<(local_198,",");
  }
  v.nb_ref._4_4_ = 0;
  v.nb_ref._0_4_ = Array::NamedCount(_sz);
  for (; v.nb_ref._4_4_ < (uint)v.nb_ref; v.nb_ref._4_4_ = v.nb_ref._4_4_ + 1) {
    Array::GetNamedVariable((Array *)local_210,(uint)_sz);
    pOVar4 = Variable::operator->((Variable *)local_210);
    this_00 = Object::GetType(pOVar4);
    bVar1 = Type::operator!=(this_00,(Type *)_type_undefined);
    if (bVar1) {
      poVar5 = std::operator<<(local_198,"[\'");
      pcVar6 = Array::GetNamedKey(_sz,v.nb_ref._4_4_);
      poVar5 = std::operator<<(poVar5,pcVar6);
      poVar5 = std::operator<<(poVar5,"\']:");
      Variable::operator_cast_to_string(local_230);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      std::operator<<(poVar5,pcVar6);
      std::__cxx11::string::~string((string *)local_230);
      if (v.nb_ref._4_4_ < (uint)v.nb_ref - 1) {
        std::operator<<(local_198,",");
      }
    }
    Variable::~Variable((Variable *)local_210);
  }
  std::operator<<(local_198,"}");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return this;
}

Assistant:

std::string LiteScript::_Type_ARRAY::ToString(const Variable &object) const {
    std::stringstream ss;
    ss << "{";
    const Array& obj = object->GetData<Array>();
    for (unsigned int i = 0, sz = obj.UnamedCount(); i < sz; i++) {
        if (obj.ExistUnamed(i)) {
            ss << "[" << i << "]:" << ((std::string) (obj.ConstantGet(i))).c_str();
            if (i < sz - 1)
                ss << ",";
        }
    }
    if (obj.UnamedCount() > 0 && obj.NamedCount() > 0)
        ss << ",";
    for (unsigned int i = 0, sz = obj.NamedCount(); i < sz; i++) {
        Variable v = obj.GetNamedVariable(i);
        if (v->GetType() != Type::UNDEFINED) {
            ss << "['" << obj.GetNamedKey(i) << "']:" << ((std::string) (v)).c_str();
            if (i < sz - 1)
                ss << ",";
        }
    }
    ss << "}";
    return ss.str();
}